

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool __thiscall
cmInstallCommand::HandleFilesMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  PolicyStatus PVar5;
  int iVar6;
  ostream *poVar7;
  string *psVar8;
  undefined4 extraout_var;
  cmGlobalGenerator *pcVar9;
  cmInstallFilesGenerator *g;
  PolicyID id;
  char *pcVar10;
  MessageType t;
  pointer pbVar11;
  string local_680;
  undefined8 local_660;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absFiles;
  cmCAStringVector files;
  ostringstream e;
  cmInstallCommandArguments ica;
  
  bVar3 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start,"PROGRAMS");
  cmInstallCommandArguments::cmInstallCommandArguments(&ica,&this->DefaultComponentName);
  pcVar10 = "FILES";
  if (bVar3) {
    pcVar10 = "PROGRAMS";
  }
  cmCAStringVector::cmCAStringVector(&files,&ica.Parser,pcVar10,(cmCommandArgumentGroup *)0x0);
  cmCommandArgument::Follows(&files.super_cmCommandArgument,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows(&ica.ArgumentGroup,&files.super_cmCommandArgument);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCommandArgumentsHelper::Parse(&ica.Parser,args,&unknownArgs);
  pbVar2 = files.Vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar11 = files.Vector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar7 = std::operator<<((ostream *)&e,
                             (string *)
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
    poVar7 = std::operator<<(poVar7," given unknown argument \"");
    poVar7 = std::operator<<(poVar7,(string *)
                                    unknownArgs.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    std::operator<<(poVar7,"\".");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_680);
LAB_002d54a4:
    std::__cxx11::string::~string((string *)&local_680);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar3 = false;
    goto LAB_002d54bd;
  }
  if (files.Vector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      files.Vector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = true;
    goto LAB_002d54bd;
  }
  psVar8 = cmInstallCommandArguments::GetRename_abi_cxx11_(&ica);
  if ((0x20 < (ulong)((long)pbVar2 - (long)pbVar11)) && (psVar8->_M_string_length != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar7 = std::operator<<((ostream *)&e,
                             (string *)
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
    std::operator<<(poVar7," given RENAME option with more than one file.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_680);
    goto LAB_002d54a4;
  }
  absFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  absFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  absFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar4 = MakeFilesFullPath(this,(((args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                            &files.Vector,&absFiles);
  if (bVar4) {
    PVar5 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0062);
    local_660 = CONCAT44(extraout_var,PVar5);
    pcVar9 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    iVar6 = (int)local_660;
    for (pbVar11 = files.Vector.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar11 !=
        files.Vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 1) {
      bVar4 = cmGlobalGenerator::IsExportedTargetsFile(pcVar9,pbVar11);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        bVar4 = true;
        pcVar10 = "may";
        t = FATAL_ERROR;
        if (iVar6 - 2U < 3) {
LAB_002d5690:
          poVar7 = std::operator<<((ostream *)&e,"The file\n  ");
          poVar7 = std::operator<<(poVar7,(string *)pbVar11);
          poVar7 = std::operator<<(poVar7,"\nwas generated by the export() command.  It ");
          poVar7 = std::operator<<(poVar7,pcVar10);
          std::operator<<(poVar7,
                          " not be installed with the install() command.  Use the install(EXPORT) mechanism instead.  See the cmake-packages(7) manual for more.\n"
                         );
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,t,&local_680,false);
          std::__cxx11::string::~string((string *)&local_680);
          if (bVar4) goto LAB_002d5803;
        }
        else if ((int)local_660 == 1) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_680,(cmPolicies *)0x3e,id);
          poVar7 = std::operator<<((ostream *)&e,(string *)&local_680);
          std::operator<<(poVar7,"\n");
          std::__cxx11::string::~string((string *)&local_680);
          bVar4 = false;
          pcVar10 = "should";
          t = AUTHOR_WARNING;
          goto LAB_002d5690;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
    }
    bVar4 = cmInstallCommandArguments::Finalize(&ica);
    if (!bVar4) goto LAB_002d5810;
    psVar8 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
    if (psVar8->_M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar7 = std::operator<<((ostream *)&e,
                               (string *)
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
      std::operator<<(poVar7," given no DESTINATION!");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_680);
      std::__cxx11::string::~string((string *)&local_680);
LAB_002d5803:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      goto LAB_002d5810;
    }
    pcVar1 = (this->super_cmCommand).Makefile;
    g = CreateInstallFilesGenerator(pcVar1,&absFiles,&ica,bVar3);
    cmMakefile::AddInstallGenerator(pcVar1,&g->super_cmInstallGenerator);
    pcVar9 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    psVar8 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&ica);
    bVar3 = true;
    cmGlobalGenerator::AddInstallComponent(pcVar9,(psVar8->_M_dataplus)._M_p);
  }
  else {
LAB_002d5810:
    bVar3 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&absFiles);
LAB_002d54bd:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  cmCAStringVector::~cmCAStringVector(&files);
  cmInstallCommandArguments::~cmInstallCommandArguments(&ica);
  return bVar3;
}

Assistant:

bool cmInstallCommand::HandleFilesMode(std::vector<std::string> const& args)
{
  // This is the FILES mode.
  bool programs = (args[0] == "PROGRAMS");
  cmInstallCommandArguments ica(this->DefaultComponentName);
  cmCAStringVector files(&ica.Parser, programs ? "PROGRAMS" : "FILES");
  files.Follows(0);
  ica.ArgumentGroup.Follows(&files);
  std::vector<std::string> unknownArgs;
  ica.Parse(&args, &unknownArgs);

  if(!unknownArgs.empty())
    {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
    }

  const std::vector<std::string>& filesVector = files.GetVector();

  // Check if there is something to do.
  if(filesVector.empty())
    {
    return true;
    }

  if(!ica.GetRename().empty() && filesVector.size() > 1)
    {
    // The rename option works only with one file.
    std::ostringstream e;
    e << args[0] << " given RENAME option with more than one file.";
    this->SetError(e.str());
    return false;
    }

  std::vector<std::string> absFiles;
  if (!this->MakeFilesFullPath(args[0].c_str(), filesVector, absFiles))
    {
    return false;
    }

  cmPolicies::PolicyStatus status =
      this->Makefile->GetPolicyStatus(cmPolicies::CMP0062);

  cmGlobalGenerator *gg = this->Makefile->GetGlobalGenerator();
  for(std::vector<std::string>::const_iterator fileIt = filesVector.begin();
      fileIt != filesVector.end(); ++fileIt)
    {
    if (gg->IsExportedTargetsFile(*fileIt))
      {
      const char *modal = 0;
      std::ostringstream e;
      cmake::MessageType messageType = cmake::AUTHOR_WARNING;

      switch(status)
        {
        case cmPolicies::WARN:
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0062) << "\n";
          modal = "should";
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          modal = "may";
          messageType = cmake::FATAL_ERROR;
        }
      if (modal)
        {
        e << "The file\n  " << *fileIt << "\nwas generated by the export() "
          "command.  It " << modal << " not be installed with the "
          "install() command.  Use the install(EXPORT) mechanism "
          "instead.  See the cmake-packages(7) manual for more.\n";
        this->Makefile->IssueMessage(messageType, e.str());
        if (messageType == cmake::FATAL_ERROR)
          {
          return false;
          }
        }
      }
    }

  if (!ica.Finalize())
    {
    return false;
    }

  if(ica.GetDestination().empty())
    {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
    }

  // Create the files install generator.
  this->Makefile->AddInstallGenerator(
    CreateInstallFilesGenerator(this->Makefile, absFiles, ica, programs));

  //Tell the global generator about any installation component names specified.
  this->Makefile->GetGlobalGenerator()
                             ->AddInstallComponent(ica.GetComponent().c_str());

  return true;
}